

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

SQInteger __thiscall SQLexer::ReadNumber(SQLexer *this)

{
  sqvector<char> *this_00;
  LexChar LVar1;
  int iVar2;
  ulong in_RAX;
  SQInteger SVar3;
  byte bVar4;
  long lVar5;
  SQChar *sTemp;
  
  LVar1 = this->_currdata;
  this_00 = &this->_longstr;
  sTemp = (SQChar *)(in_RAX & 0xffffffffffffff00);
  sqvector<char>::resize(this_00,0,(char *)&sTemp);
  Next(this);
  this->_currentcolumn = this->_currentcolumn + 1;
  if (LVar1 == '0') {
    bVar4 = this->_currdata;
    iVar2 = toupper((uint)bVar4);
    if (iVar2 == 0x58 || (bVar4 & 0xf8) == 0x30) {
      if ((bVar4 & 0xf8) == 0x30) {
        while ((bVar4 & 0xf8) == 0x30) {
          sTemp = (SQChar *)CONCAT71(sTemp._1_7_,bVar4);
          sqvector<char>::push_back(this_00,(char *)&sTemp);
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          bVar4 = this->_currdata;
        }
        if (bVar4 - 0x30 < 10) {
          (*this->_errfunc)(this->_errtarget,"invalid octal number");
        }
        sTemp = (SQChar *)((ulong)sTemp & 0xffffffffffffff00);
        sqvector<char>::push_back(this_00,(char *)&sTemp);
        LexOctal((this->_longstr)._vals,(SQUnsignedInteger *)&this->_nvalue);
      }
      else {
        while( true ) {
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          bVar4 = this->_currdata;
          iVar2 = isxdigit((uint)bVar4);
          if (iVar2 == 0) break;
          sTemp = (SQChar *)CONCAT71(sTemp._1_7_,bVar4);
          sqvector<char>::push_back(this_00,(char *)&sTemp);
        }
        if (0x10 < (this->_longstr)._size) {
          (*this->_errfunc)(this->_errtarget,"too many digits for an Hex number");
        }
        sTemp = (SQChar *)((ulong)sTemp & 0xffffffffffffff00);
        sqvector<char>::push_back(this_00,(char *)&sTemp);
        LexHexadecimal((this->_longstr)._vals,(SQUnsignedInteger *)&this->_nvalue);
      }
      return 0x104;
    }
  }
  sTemp = (SQChar *)CONCAT71(sTemp._1_7_,LVar1);
  sqvector<char>::push_back(this_00,(char *)&sTemp);
  lVar5 = 1;
  do {
    bVar4 = this->_currdata;
    if (bVar4 - 0x30 < 10 || bVar4 == 0x2e) {
      if ((bVar4 - 0x2e < 0x38) && ((0x80000000800001U >> ((ulong)(bVar4 - 0x2e) & 0x3f) & 1) != 0))
      goto LAB_00115d8f;
      if ((bVar4 & 0xdf) == 0x45) {
        if (lVar5 != 2) {
          (*this->_errfunc)(this->_errtarget,"invalid numeric format");
          bVar4 = this->_currdata;
        }
        goto LAB_00115d9c;
      }
    }
    else {
      if ((bVar4 & 0xdf) != 0x45) {
        sTemp = (SQChar *)((ulong)sTemp & 0xffffffffffffff00);
        sqvector<char>::push_back(this_00,(char *)&sTemp);
        SVar3 = (*(code *)(&DAT_001280f8 + *(int *)(&DAT_001280f8 + (lVar5 + -1) * 4)))();
        return SVar3;
      }
LAB_00115d8f:
      lVar5 = 2;
      if ((bVar4 & 0xdf) == 0x45) {
LAB_00115d9c:
        sTemp = (SQChar *)CONCAT71(sTemp._1_7_,bVar4);
        sqvector<char>::push_back(this_00,(char *)&sTemp);
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        bVar4 = this->_currdata;
        if ((bVar4 == 0x2d) || (bVar4 == 0x2b)) {
          sTemp = (SQChar *)CONCAT71(sTemp._1_7_,bVar4);
          sqvector<char>::push_back(this_00,(char *)&sTemp);
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          bVar4 = this->_currdata;
        }
        lVar5 = 4;
        if (9 < bVar4 - 0x30) {
          (*this->_errfunc)(this->_errtarget,"exponent expected");
          bVar4 = this->_currdata;
        }
      }
    }
    sTemp = (SQChar *)CONCAT71(sTemp._1_7_,bVar4);
    sqvector<char>::push_back(this_00,(char *)&sTemp);
    Next(this);
    this->_currentcolumn = this->_currentcolumn + 1;
  } while( true );
}

Assistant:

SQInteger SQLexer::ReadNumber()
{
#define TINT 1
#define TFLOAT 2
#define THEX 3
#define TSCIENTIFIC 4
#define TOCTAL 5
    SQInteger type = TINT, firstchar = CUR_CHAR;
    SQChar *sTemp;
    INIT_TEMP_STRING();
    NEXT();
    if(firstchar == _SC('0') && (toupper(CUR_CHAR) == _SC('X') || scisodigit(CUR_CHAR)) ) {
        if(scisodigit(CUR_CHAR)) {
            type = TOCTAL;
            while(scisodigit(CUR_CHAR)) {
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
            if(scisdigit(CUR_CHAR)) Error(_SC("invalid octal number"));
        }
        else {
            NEXT();
            type = THEX;
            while(isxdigit(CUR_CHAR)) {
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
            if(_longstr.size() > MAX_HEX_DIGITS) Error(_SC("too many digits for an Hex number"));
        }
    }
    else {
        APPEND_CHAR((int)firstchar);
        while (CUR_CHAR == _SC('.') || scisdigit(CUR_CHAR) || isexponent(CUR_CHAR)) {
            if(CUR_CHAR == _SC('.') || isexponent(CUR_CHAR)) type = TFLOAT;
            if(isexponent(CUR_CHAR)) {
                if(type != TFLOAT) Error(_SC("invalid numeric format"));
                type = TSCIENTIFIC;
                APPEND_CHAR(CUR_CHAR);
                NEXT();
                if(CUR_CHAR == '+' || CUR_CHAR == '-'){
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                }
                if(!scisdigit(CUR_CHAR)) Error(_SC("exponent expected"));
            }

            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
    }
    TERMINATE_BUFFER();
    switch(type) {
    case TSCIENTIFIC:
    case TFLOAT:
        _fvalue = (SQFloat)scstrtod(&_longstr[0],&sTemp);
        return TK_FLOAT;
    case TINT:
        LexInteger(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    case THEX:
        LexHexadecimal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    case TOCTAL:
        LexOctal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    }
    return 0;
}